

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EVPathRemote.cpp
# Opt level: O0

void __thiscall adios2::EVPathRemote::InitCMData(EVPathRemote *this)

{
  anon_class_8_1_8991fb9c *in_stack_00000008;
  Remote_evpath_state *in_stack_00000020;
  
  CManagerSingleton::Instance(in_stack_00000020);
  std::call_once<adios2::EVPathRemote::InitCMData()::__0>((once_flag *)this,in_stack_00000008);
  return;
}

Assistant:

void EVPathRemote::InitCMData()
{
    (void)CManagerSingleton::Instance(ev_state);
    static std::once_flag flag;
    std::call_once(flag, [&]() {
        CMregister_handler(ev_state.OpenResponseFormat, (CMHandlerFunc)OpenResponseHandler,
                           &ev_state);
        CMregister_handler(ev_state.ReadResponseFormat, (CMHandlerFunc)ReadResponseHandler,
                           &ev_state);
        CMregister_handler(ev_state.OpenSimpleResponseFormat,
                           (CMHandlerFunc)OpenSimpleResponseHandler, &ev_state);
        CMregister_handler(ev_state.ReadResponseFormat, (CMHandlerFunc)ReadResponseHandler,
                           &ev_state);
    });
}